

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector y,N_Vector w,realtype tol,int callSetup,
              void *mem)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  N_Vector z;
  N_Vector x;
  N_Vector z_00;
  int *piVar4;
  double *pdVar5;
  N_Vector p_Var6;
  N_Vector y_00;
  long lVar7;
  N_Vector *Y;
  realtype *c;
  N_Vector *X;
  realtype *dotprods;
  N_Vector z_01;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  uint nvec;
  long lVar22;
  realtype rVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  auVar25._0_4_ = -(uint)(NLS == (SUNNonlinearSolver)0x0);
  auVar25._4_4_ = -(uint)(y0 == (N_Vector)0x0);
  auVar25._8_4_ = -(uint)(y == (N_Vector)0x0);
  auVar25._12_4_ = -(uint)(w == (N_Vector)0x0);
  iVar13 = movmskps((int)w,auVar25);
  if (iVar13 == 0 && mem != (void *)0x0) {
    pvVar16 = NLS->content;
    z = *(N_Vector *)((long)pvVar16 + 0x58);
    x = *(N_Vector *)((long)pvVar16 + 0x60);
    z_00 = *(N_Vector *)((long)pvVar16 + 0x78);
    N_VScale(1.0,y0,y);
    pvVar16 = NLS->content;
    *(undefined4 *)((long)pvVar16 + 0x80) = 0;
    iVar13 = 0;
    while (iVar13 < *(int *)((long)pvVar16 + 0x84)) {
      N_VScale(1.0,y,z);
      iVar13 = (**NLS->content)(y,x,mem);
      pvVar16 = NLS->content;
      if (iVar13 != 0) break;
      uVar3 = *(uint *)((long)pvVar16 + 0x10);
      lVar20 = (long)(int)uVar3;
      if (lVar20 == 0) {
LAB_00102852:
        N_VScale(1.0,x,y);
      }
      else {
        nvec = *(uint *)((long)pvVar16 + 0x80);
        piVar4 = *(int **)((long)pvVar16 + 0x18);
        pdVar5 = *(double **)((long)pvVar16 + 0x20);
        p_Var6 = *(N_Vector *)((long)pvVar16 + 0x70);
        y_00 = *(N_Vector *)((long)pvVar16 + 0x68);
        lVar19 = *(long *)((long)pvVar16 + 0x38);
        lVar7 = *(long *)((long)pvVar16 + 0x40);
        Y = *(N_Vector **)((long)pvVar16 + 0x48);
        c = *(realtype **)((long)pvVar16 + 0x30);
        X = *(N_Vector **)((long)pvVar16 + 0x50);
        dotprods = *(realtype **)((long)pvVar16 + 0x28);
        z_01 = *(N_Vector *)((long)pvVar16 + 0x78);
        uVar10 = 0;
        if (0 < (int)uVar3) {
          uVar10 = (ulong)uVar3;
        }
        for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
          piVar4[uVar14] = 0;
        }
        uVar8 = nvec - 1;
        uVar10 = (long)(int)uVar8 % (long)(int)uVar3 & 0xffffffff;
        N_VLinearSum(1.0,x,-1.0,z,z_01);
        iVar13 = (int)((long)(int)uVar8 % (long)(int)uVar3);
        lVar22 = (long)iVar13;
        if (0 < (int)nvec) {
          N_VLinearSum(1.0,x,-1.0,p_Var6,*(N_Vector *)(lVar7 + lVar22 * 8));
          N_VLinearSum(1.0,z_01,-1.0,y_00,*(N_Vector *)(lVar19 + lVar22 * 8));
        }
        N_VScale(1.0,x,p_Var6);
        N_VScale(1.0,z_01,y_00);
        if (nvec == 1) {
          p_Var6 = *(N_Vector *)(lVar19 + uVar10 * 8);
          rVar23 = N_VDotProd(p_Var6,p_Var6);
          dVar26 = 0.0;
          if (0.0 < rVar23) {
            p_Var6 = *(N_Vector *)(lVar19 + uVar10 * 8);
            rVar23 = N_VDotProd(p_Var6,p_Var6);
            if (rVar23 < 0.0) {
              dVar26 = sqrt(rVar23);
            }
            else {
              dVar26 = SQRT(rVar23);
            }
          }
          *pdVar5 = dVar26;
          N_VScale(1.0 / dVar26,*(N_Vector *)(lVar19 + uVar10 * 8),Y[uVar10]);
          *piVar4 = 0;
        }
        else {
          if (nvec == 0) goto LAB_00102852;
          if ((int)uVar3 < (int)nvec) {
            uVar8 = uVar3 - 1;
            uVar10 = 0;
            if (0 < (int)uVar8) {
              uVar10 = (ulong)uVar8;
            }
            iVar9 = 2;
            pdVar18 = pdVar5;
            uVar14 = 0;
            while (uVar14 != uVar10) {
              lVar11 = (long)iVar9;
              lVar15 = lVar20 * 8 * lVar11;
              uVar1 = uVar14 + 1;
              lVar17 = uVar1 * lVar20;
              auVar25 = *(undefined1 (*) [16])(pdVar5 + lVar17 + uVar14);
              dVar26 = auVar25._0_8_ * auVar25._0_8_ + auVar25._8_8_ * auVar25._8_8_;
              auVar27._0_8_ = (double)(-(ulong)(0.0 < dVar26) & (ulong)SQRT(dVar26));
              pdVar5[lVar17 + uVar14] = auVar27._0_8_;
              pdVar5[lVar17 + uVar14 + 1] = 0.0;
              auVar27._8_8_ = auVar27._0_8_;
              auVar25 = divpd(auVar25,auVar27);
              rVar23 = auVar25._0_8_;
              dVar26 = auVar25._8_8_;
              for (; lVar11 < lVar20; lVar11 = lVar11 + 1) {
                dVar24 = *(double *)((long)pdVar18 + lVar15 + 8);
                auVar28._8_8_ = *(double *)((long)pdVar18 + lVar15) * -dVar26 + dVar24 * rVar23;
                auVar28._0_8_ = *(double *)((long)pdVar18 + lVar15) * rVar23 + dVar24 * dVar26;
                *(undefined1 (*) [16])((long)pdVar18 + lVar15) = auVar28;
                lVar15 = lVar15 + lVar20 * 8;
              }
              N_VLinearSum(rVar23,Y[uVar14],dVar26,Y[uVar1],y);
              N_VLinearSum(-dVar26,Y[uVar14],rVar23,Y[uVar1],Y[uVar1]);
              N_VScale(1.0,y,Y[uVar14]);
              iVar9 = iVar9 + 1;
              pdVar18 = pdVar18 + 1;
              uVar14 = uVar1;
            }
            pdVar18 = pdVar5;
            for (lVar11 = 1; uVar14 = uVar10, pdVar21 = pdVar18, lVar11 < lVar20;
                lVar11 = lVar11 + 1) {
              while (uVar14 != 0) {
                *pdVar21 = pdVar21[lVar20];
                uVar14 = uVar14 - 1;
                pdVar21 = pdVar21 + 1;
              }
              pdVar18 = pdVar18 + lVar20;
            }
            N_VScale(1.0,*(N_Vector *)(lVar19 + lVar22 * 8),y);
            for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
              rVar23 = N_VDotProd(Y[uVar14],y);
              pdVar5[(long)(int)(uVar8 * uVar3) + uVar14] = rVar23;
              N_VLinearSum(1.0,y,-rVar23,Y[uVar14],y);
            }
            rVar23 = N_VDotProd(y,y);
            dVar26 = 0.0;
            if (0.0 < rVar23) {
              rVar23 = N_VDotProd(y,y);
              if (rVar23 < 0.0) {
                dVar26 = sqrt(rVar23);
              }
              else {
                dVar26 = SQRT(rVar23);
              }
            }
            pdVar5[(long)(int)(uVar3 * uVar3) + -1] = dVar26;
            N_VScale(1.0 / dVar26,y,Y[lVar20 + -1]);
            piVar12 = piVar4;
            for (lVar19 = 0; iVar9 = iVar13 + 1 + (int)lVar19, iVar9 < (int)uVar3;
                lVar19 = lVar19 + 1) {
              piVar4[lVar19] = iVar9;
              piVar12 = piVar12 + 1;
            }
            for (iVar9 = 0; iVar9 <= iVar13; iVar9 = iVar9 + 1) {
              *piVar12 = iVar9;
              piVar12 = piVar12 + 1;
            }
          }
          else {
            N_VScale(1.0,*(N_Vector *)(lVar19 + lVar22 * 8),y);
            uVar10 = 0;
            if (0 < (int)uVar8) {
              uVar10 = (ulong)uVar8;
            }
            for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
              piVar4[uVar14] = (int)uVar14;
              rVar23 = N_VDotProd(Y[uVar14],y);
              pdVar5[(long)(int)(uVar8 * uVar3) + uVar14] = rVar23;
              N_VLinearSum(1.0,y,-rVar23,Y[uVar14],y);
            }
            rVar23 = N_VDotProd(y,y);
            dVar26 = 0.0;
            if (0.0 < rVar23) {
              rVar23 = N_VDotProd(y,y);
              if (rVar23 < 0.0) {
                dVar26 = sqrt(rVar23);
              }
              else {
                dVar26 = SQRT(rVar23);
              }
            }
            pdVar5[(long)(int)(uVar8 * uVar3 + nvec) + -1] = dVar26;
            N_VScale((realtype)(~-(ulong)(dVar26 == 0.0) & (ulong)(1.0 / dVar26)),y,Y[lVar22]);
            piVar4[(int)uVar8] = uVar8;
          }
        }
        if ((int)uVar3 < (int)nvec) {
          nvec = uVar3;
        }
        iVar13 = N_VDotProdMulti(nvec,z_01,Y,dotprods);
        if (iVar13 == 0) {
          *c = 1.0;
          *X = x;
          lVar11 = (long)(int)nvec;
          pdVar18 = (double *)((long)pdVar5 + (lVar20 * 8 + 8) * lVar11 + -8);
          lVar19 = 1;
          lVar22 = lVar11;
          while (0 < lVar22) {
            lVar15 = lVar22 + -1;
            pdVar21 = pdVar18;
            for (; lVar22 < lVar11; lVar22 = lVar22 + 1) {
              dotprods[lVar15] = dotprods[lVar15] - *pdVar21 * dotprods[lVar22];
              pdVar21 = pdVar21 + lVar20;
            }
            dVar26 = dotprods[lVar15];
            dVar24 = 0.0;
            if ((dVar26 != 0.0) || (NAN(dVar26))) {
              dVar24 = dVar26 / pdVar5[(int)((uVar3 + 1) * (int)lVar15)];
            }
            dotprods[lVar15] = dVar24;
            c[lVar19] = -dVar24;
            X[lVar19] = *(N_Vector *)(lVar7 + (long)piVar4[lVar15] * 8);
            lVar19 = lVar19 + 1;
            pdVar18 = (double *)((long)pdVar18 + (lVar20 * 8 ^ 0xfffffffffffffff8U));
            lVar22 = lVar15;
          }
          N_VLinearCombination((int)lVar19,c,X,y);
        }
      }
      plVar2 = (long *)((long)NLS->content + 0x88);
      *plVar2 = *plVar2 + 1;
      N_VLinearSum(1.0,y,-1.0,z,z_00);
      iVar13 = (**(code **)((long)NLS->content + 8))(tol,NLS,y,z_00,w,mem);
      if (iVar13 != 1) {
        if (iVar13 == 0) {
          return 0;
        }
        pvVar16 = NLS->content;
        goto LAB_00102ec9;
      }
      pvVar16 = NLS->content;
      iVar13 = *(int *)((long)pvVar16 + 0x80) + 1;
      *(int *)((long)pvVar16 + 0x80) = iVar13;
    }
    iVar13 = 2;
LAB_00102ec9:
    *(long *)((long)pvVar16 + 0x90) = *(long *)((long)pvVar16 + 0x90) + 1;
  }
  else {
    iVar13 = -1;
  }
  return iVar13;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS, N_Vector y0,
                                 N_Vector y, N_Vector w, realtype tol,
                                 booleantype callSetup, void* mem)
{
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that the inputs are non-null */
  if ( (NLS == NULL) || (y0 == NULL) || (y == NULL) || (w == NULL) || (mem == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* load prediction into y */
  N_VScale(ONE, y0, y);

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for( FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++ ) {

    /* update previous solution guess */
    N_VScale(ONE, y, yprev);

    /* compute fixed-point iteration function, store in gy */
    retval = FP_CONTENT(NLS)->Sys(y, gy, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0) {    /* basic fixed-point solver */
      N_VScale(ONE, gy, y);
    } else {                          /* Anderson-accelerated solver */
      retval = AndersonAccelerate(NLS, gy, y, yprev, FP_CONTENT(NLS)->curiter);
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, y, -ONE, yprev, delta);

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, y, delta, tol, w, mem);

    /* return if successful */
    if (retval == SUN_NLS_SUCCESS)  return(SUN_NLS_SUCCESS);

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE) {
      FP_CONTENT(NLS)->nconvfails++;
      return(retval);
    }

  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return(SUN_NLS_CONV_RECVR);
}